

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O1

ActionResults * __thiscall BlueRoomThreeAction::Look(BlueRoomThreeAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == PIPE) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "The pipes appear to be some complex, interconnected mechanism, each about 3 inches in diameter."
               ,"");
    ActionResults::ActionResults(pAVar2,CURRENT,&local_38);
    _Var3._M_p = local_38._M_dataplus._M_p;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != BALL) {
      pAVar2 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "The ball is between 2 to 3 inches in diameter. Looks like it might fit through those pipes."
               ,"");
    ActionResults::ActionResults(pAVar2,CURRENT,&local_58);
    _Var3._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  return pAVar2;
}

Assistant:

ActionResults * BlueRoomThreeAction::Look() {
    if (commands->getMainItem() == PIPE) {
        return new ActionResults(CURRENT, "The pipes appear to be some complex, interconnected mechanism, each about 3 inches in diameter.");
    } else if(commands->getMainItem() == BALL){
        return new ActionResults(CURRENT, "The ball is between 2 to 3 inches in diameter. Looks like it might fit through those pipes.");
    } else {
        return AbstractRoomAction::Look();
    }
}